

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_object.cc
# Opt level: O0

ASN1_OBJECT * ASN1_OBJECT_create(int nid,uchar *data,int len,char *sn,char *ln)

{
  undefined4 in_register_00000014;
  undefined1 local_60 [8];
  ASN1_OBJECT o;
  char *ln_local;
  char *sn_local;
  size_t len_local;
  uchar *data_local;
  ASN1_OBJECT *pAStack_10;
  int nid_local;
  
  o._32_8_ = ln;
  if (CONCAT44(in_register_00000014,len) < 0x80000000) {
    o.data._0_4_ = 0xd;
    local_60 = (undefined1  [8])sn;
    o.sn = ln;
    o.ln._0_4_ = nid;
    o.ln._4_4_ = len;
    o._16_8_ = data;
    pAStack_10 = OBJ_dup((ASN1_OBJECT *)local_60);
  }
  else {
    ERR_put_error(0xc,0,0xad,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_object.cc"
                  ,0xb4);
    pAStack_10 = (ASN1_OBJECT *)0x0;
  }
  return pAStack_10;
}

Assistant:

ASN1_OBJECT *ASN1_OBJECT_create(int nid, const unsigned char *data, size_t len,
                                const char *sn, const char *ln) {
  if (len > INT_MAX) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_STRING_TOO_LONG);
    return NULL;
  }

  ASN1_OBJECT o;
  o.sn = sn;
  o.ln = ln;
  o.data = data;
  o.nid = nid;
  o.length = (int)len;
  o.flags = ASN1_OBJECT_FLAG_DYNAMIC | ASN1_OBJECT_FLAG_DYNAMIC_STRINGS |
            ASN1_OBJECT_FLAG_DYNAMIC_DATA;
  return OBJ_dup(&o);
}